

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::ClientImpl::read_response_line(ClientImpl *this,Stream *strm,Request *req,Response *res)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  int extraout_var;
  size_t sVar5;
  int extraout_var_00;
  int extraout_var_01;
  undefined1 **ppuVar6;
  pointer psVar7;
  undefined8 uVar8;
  long lVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  char byte_1;
  cmatch m;
  array<char,_2048UL> buf;
  char *local_8c8;
  undefined8 local_8c0;
  char local_8b8;
  undefined7 uStack_8b7;
  Stream *local_8a8;
  undefined1 *local_8a0;
  long local_898;
  ulong local_890;
  undefined1 *local_888;
  long local_880;
  undefined1 local_878;
  undefined7 uStack_877;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_868;
  char *local_840;
  string *local_838;
  undefined1 local_830 [2048];
  
  lVar9 = 0;
  memset(local_830,0,0x800);
  local_898 = 0x800;
  local_890 = 0;
  local_888 = &local_878;
  local_880 = 0;
  local_878 = 0;
  local_8a8 = strm;
  local_8a0 = local_830;
  do {
    iVar4 = (*local_8a8->_vptr_Stream[4])(local_8a8,&local_868,1);
    uVar3 = local_890;
    cVar10 = (char)&local_888;
    if (extraout_var < 0) {
      bVar11 = false;
      bVar12 = false;
    }
    else if (CONCAT44(extraout_var,iVar4) == 0) {
      bVar12 = lVar9 != 0;
      bVar11 = false;
    }
    else {
      if (local_890 < local_898 - 1U) {
        local_890 = local_890 + 1;
        local_8a0[uVar3] =
             (char)local_868.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_8a0[local_890] = 0;
      }
      else {
        if (local_880 == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_888,0,(char *)0x0,(ulong)local_8a0);
        }
        std::__cxx11::string::push_back(cVar10);
      }
      bVar11 = (char)local_868.
                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != '\n';
      bVar12 = true;
    }
    lVar9 = lVar9 + -1;
  } while (bVar11);
  if (bVar12) {
    if (read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)::
        re_abi_cxx11_ == '\0') goto LAB_0011c3dd;
    while( true ) {
      local_868.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_868._M_begin = (char *)0x0;
      local_868.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_868.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ppuVar6 = &local_888;
      if (local_880 == 0) {
        ppuVar6 = &local_8a0;
      }
      pcVar2 = *ppuVar6;
      sVar5 = strlen(pcVar2);
      bVar11 = std::__detail::
               __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                         (pcVar2,pcVar2 + sVar5,&local_868,
                          &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                           ::re_abi_cxx11_,0);
      if (!bVar11) break;
      if (local_868.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_868.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar11 = false;
      }
      else {
        bVar11 = ((long)local_868.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_868.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 5U <
                 0xfffffffffffffffe;
      }
      psVar7 = local_868.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -3;
      if (bVar11) {
        psVar7 = local_868.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      if (psVar7->matched == true) {
        local_8c8 = &local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8c8,(psVar7->super_pair<const_char_*,_const_char_*>).first,
                   (psVar7->super_pair<const_char_*,_const_char_*>).second);
      }
      else {
        local_8c8 = &local_8b8;
        local_8c0 = 0;
        local_8b8 = '\0';
      }
      std::__cxx11::string::operator=((string *)res,(string *)&local_8c8);
      if (local_8c8 != &local_8b8) {
        operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
      }
      if (local_868.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_868.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar11 = false;
      }
      else {
        bVar11 = ((long)local_868.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_868.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 6U <
                 0xfffffffffffffffd;
      }
      local_8c8 = &local_8b8;
      psVar7 = local_868.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -3;
      if (bVar11) {
        psVar7 = local_868.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
      }
      if (psVar7->matched == true) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8c8,(psVar7->super_pair<const_char_*,_const_char_*>).first,
                   (psVar7->super_pair<const_char_*,_const_char_*>).second);
      }
      else {
        local_8c0 = 0;
        local_8b8 = '\0';
      }
      pcVar2 = local_8c8;
      req = (Request *)__errno_location();
      iVar4 = *(int *)&(req->method)._M_dataplus._M_p;
      *(int *)&(req->method)._M_dataplus._M_p = 0;
      lVar9 = strtol(pcVar2,&local_840,10);
      if (local_840 == pcVar2) {
        std::__throw_invalid_argument("stoi");
LAB_0011c440:
        uVar8 = std::__throw_out_of_range("stoi");
        __cxa_guard_abort(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                           ::re_abi_cxx11_);
        if (local_888 != &local_878) {
          operator_delete(local_888,CONCAT71(uStack_877,local_878) + 1);
        }
        _Unwind_Resume(uVar8);
      }
      if (((int)lVar9 != lVar9) || (iVar1 = *(int *)&(req->method)._M_dataplus._M_p, iVar1 == 0x22))
      goto LAB_0011c440;
      if (iVar1 == 0) {
        *(int *)&(req->method)._M_dataplus._M_p = iVar4;
      }
      res->status = (int)lVar9;
      if (local_8c8 != &local_8b8) {
        operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
      }
      if (local_868.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_868.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar11 = false;
      }
      else {
        bVar11 = ((long)local_868.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_868.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 7U <
                 0xfffffffffffffffc;
      }
      psVar7 = local_868.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -3;
      if (bVar11) {
        psVar7 = local_868.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3;
      }
      local_8c8 = &local_8b8;
      if (psVar7->matched == true) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8c8,(psVar7->super_pair<const_char_*,_const_char_*>).first,
                   (psVar7->super_pair<const_char_*,_const_char_*>).second);
      }
      else {
        local_8c0 = 0;
        local_8b8 = '\0';
      }
      local_838 = (string *)&res->reason;
      std::__cxx11::string::operator=(local_838,(string *)&local_8c8);
      if (local_8c8 != &local_8b8) {
        operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
      }
      bVar11 = true;
      if (res->status != 100) goto LAB_0011c37e;
LAB_0011bf9e:
      local_890 = 0;
      local_880 = 0;
      *local_888 = 0;
      lVar9 = 0;
      do {
        iVar4 = (*local_8a8->_vptr_Stream[4])(local_8a8,&local_8c8,1);
        if (extraout_var_00 < 0) {
          bVar11 = false;
          bVar12 = false;
        }
        else if (CONCAT44(extraout_var_00,iVar4) == 0) {
          bVar12 = lVar9 != 0;
          bVar11 = false;
        }
        else {
          if (local_890 < local_898 - 1U) {
            *(string *)(local_8a0 + local_890) = local_8c8._0_1_;
            local_8a0[local_890 + 1] = 0;
            local_890 = local_890 + 1;
          }
          else {
            if (local_880 == 0) {
              std::__cxx11::string::_M_replace((ulong)&local_888,0,(char *)0x0,(ulong)local_8a0);
            }
            std::__cxx11::string::push_back(cVar10);
          }
          bVar11 = local_8c8._0_1_ != (string)0xa;
          bVar12 = true;
        }
        lVar9 = lVar9 + -1;
      } while (bVar11);
      if (!bVar12) {
LAB_0011c37c:
        bVar11 = false;
        goto LAB_0011c37e;
      }
      local_890 = 0;
      local_880 = 0;
      *local_888 = 0;
      lVar9 = 0;
      do {
        iVar4 = (*local_8a8->_vptr_Stream[4])(local_8a8,&local_8c8,1);
        uVar3 = local_890;
        if (extraout_var_01 < 0) {
          bVar12 = false;
          bVar11 = false;
        }
        else if (CONCAT44(extraout_var_01,iVar4) == 0) {
          bVar11 = lVar9 != 0;
          bVar12 = false;
        }
        else {
          if (local_890 < local_898 - 1U) {
            local_890 = local_890 + 1;
            *(string *)(local_8a0 + uVar3) = local_8c8._0_1_;
            local_8a0[local_890] = 0;
          }
          else {
            if (local_880 == 0) {
              std::__cxx11::string::_M_replace((ulong)&local_888,0,(char *)0x0,(ulong)local_8a0);
            }
            std::__cxx11::string::push_back(cVar10);
          }
          bVar12 = local_8c8._0_1_ != (string)0xa;
          bVar11 = true;
        }
        lVar9 = lVar9 + -1;
      } while (bVar12);
      if (!bVar11) goto LAB_0011c37c;
      ppuVar6 = &local_888;
      if (local_880 == 0) {
        ppuVar6 = &local_8a0;
      }
      pcVar2 = *ppuVar6;
      sVar5 = strlen(pcVar2);
      bVar11 = std::__detail::
               __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                         (pcVar2,pcVar2 + sVar5,&local_868,
                          &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                           ::re_abi_cxx11_,0);
      if (!bVar11) goto LAB_0011c37c;
      if (local_868.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_868.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar11 = false;
      }
      else {
        bVar11 = ((long)local_868.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_868.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 5U <
                 0xfffffffffffffffe;
      }
      psVar7 = local_868.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -3;
      if (bVar11) {
        psVar7 = local_868.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      local_8c8 = &local_8b8;
      if (psVar7->matched == true) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8c8,(psVar7->super_pair<const_char_*,_const_char_*>).first,
                   (psVar7->super_pair<const_char_*,_const_char_*>).second);
      }
      else {
        local_8c0 = 0;
        local_8b8 = '\0';
      }
      std::__cxx11::string::operator=((string *)res,(string *)&local_8c8);
      if (local_8c8 != &local_8b8) {
        operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
      }
      if (local_868.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_868.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar11 = false;
      }
      else {
        bVar11 = ((long)local_868.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_868.
                        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 6U <
                 0xfffffffffffffffd;
      }
      psVar7 = local_868.
               super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -3;
      if (bVar11) {
        psVar7 = local_868.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
      }
      if (psVar7->matched == true) {
        local_8c8 = &local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8c8,(psVar7->super_pair<const_char_*,_const_char_*>).first,
                   (psVar7->super_pair<const_char_*,_const_char_*>).second);
      }
      else {
        local_8c0 = 0;
        local_8b8 = '\0';
        local_8c8 = &local_8b8;
      }
      pcVar2 = local_8c8;
      iVar4 = *(int *)&(req->method)._M_dataplus._M_p;
      *(int *)&(req->method)._M_dataplus._M_p = 0;
      lVar9 = strtol(local_8c8,&local_840,10);
      if (local_840 != pcVar2) {
        if ((lVar9 - 0x80000000U < 0xffffffff00000000) ||
           (iVar1 = *(int *)&(req->method)._M_dataplus._M_p, iVar1 == 0x22)) goto LAB_0011c3d1;
        if (iVar1 == 0) {
          *(int *)&(req->method)._M_dataplus._M_p = iVar4;
        }
        res->status = (int)lVar9;
        if (local_8c8 != &local_8b8) {
          operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
        }
        if (local_868.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_868.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar11 = false;
        }
        else {
          bVar11 = ((long)local_868.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_868.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 7U
                   < 0xfffffffffffffffc;
        }
        psVar7 = local_868.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -3;
        if (bVar11) {
          psVar7 = local_868.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 3;
        }
        local_8c8 = &local_8b8;
        if (psVar7->matched == true) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_8c8,(psVar7->super_pair<const_char_*,_const_char_*>).first,
                     (psVar7->super_pair<const_char_*,_const_char_*>).second);
        }
        else {
          local_8c0 = 0;
          local_8b8 = '\0';
        }
        std::__cxx11::string::operator=(local_838,(string *)&local_8c8);
        if (local_8c8 != &local_8b8) {
          operator_delete(local_8c8,CONCAT71(uStack_8b7,local_8b8) + 1);
        }
        if (res->status != 100) {
          bVar11 = true;
          goto LAB_0011c37e;
        }
        goto LAB_0011bf9e;
      }
      std::__throw_invalid_argument("stoi");
LAB_0011c3d1:
      std::__throw_out_of_range("stoi");
LAB_0011c3dd:
      iVar4 = __cxa_guard_acquire(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                                   ::re_abi_cxx11_);
      if (iVar4 != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                    ::re_abi_cxx11_,"(HTTP/1\\.[01]) (\\d{3})(?: (.*?))?\r?\n",0x10);
        __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                     ~basic_regex,
                     &read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                      ::re_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&read_response_line(httplib::Stream&,httplib::Request_const&,httplib::Response&)
                             ::re_abi_cxx11_);
      }
    }
    iVar4 = std::__cxx11::string::compare((char *)req);
    bVar11 = iVar4 == 0;
LAB_0011c37e:
    if (local_868.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_868.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_868.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_868.
                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar11 = false;
  }
  if (local_888 != &local_878) {
    operator_delete(local_888,CONCAT71(uStack_877,local_878) + 1);
  }
  return bVar11;
}

Assistant:

inline bool ClientImpl::read_response_line(Stream& strm, const Request& req,
        Response& res) {
        std::array<char, 2048> buf{};

        detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

        if (!line_reader.getline()) { return false; }

    #ifdef CPPHTTPLIB_ALLOW_LF_AS_LINE_TERMINATOR
        const static std::regex re("(HTTP/1\\.[01]) (\\d{3})(?: (.*?))?\r\n");
    #else
        const static std::regex re("(HTTP/1\\.[01]) (\\d{3})(?: (.*?))?\r?\n");
    #endif

        std::cmatch m;
        if (!std::regex_match(line_reader.ptr(), m, re)) {
            return req.method == "CONNECT";
        }
        res.version = std::string(m[1]);
        res.status = std::stoi(std::string(m[2]));
        res.reason = std::string(m[3]);

        // Ignore '100 Continue'
        while (res.status == 100) {
            if (!line_reader.getline()) { return false; } // CRLF
            if (!line_reader.getline()) { return false; } // next response line

            if (!std::regex_match(line_reader.ptr(), m, re)) { return false; }
            res.version = std::string(m[1]);
            res.status = std::stoi(std::string(m[2]));
            res.reason = std::string(m[3]);
        }

        return true;
    }